

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_compileoption_used(char *zOptName)

{
  int iVar1;
  char **ppcVar2;
  char **azCompileOpt;
  int local_20;
  int nOpt;
  int n;
  int i;
  char *zOptName_local;
  
  _n = zOptName;
  ppcVar2 = sqlite3CompileOptions((int *)((long)&azCompileOpt + 4));
  iVar1 = sqlite3_strnicmp(_n,"SQLITE_",7);
  if (iVar1 == 0) {
    _n = _n + 7;
  }
  local_20 = sqlite3Strlen30(_n);
  nOpt = 0;
  while( true ) {
    if (azCompileOpt._4_4_ <= nOpt) {
      return 0;
    }
    iVar1 = sqlite3_strnicmp(_n,ppcVar2[nOpt],local_20);
    if ((iVar1 == 0) && (iVar1 = sqlite3IsIdChar(ppcVar2[nOpt][local_20]), iVar1 == 0)) break;
    nOpt = nOpt + 1;
  }
  return 1;
}

Assistant:

SQLITE_API int sqlite3_compileoption_used(const char *zOptName){
  int i, n;
  int nOpt;
  const char **azCompileOpt;
 
#if SQLITE_ENABLE_API_ARMOR
  if( zOptName==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  azCompileOpt = sqlite3CompileOptions(&nOpt);

  if( sqlite3StrNICmp(zOptName, "SQLITE_", 7)==0 ) zOptName += 7;
  n = sqlite3Strlen30(zOptName);

  /* Since nOpt is normally in single digits, a linear search is 
  ** adequate. No need for a binary search. */
  for(i=0; i<nOpt; i++){
    if( sqlite3StrNICmp(zOptName, azCompileOpt[i], n)==0
     && sqlite3IsIdChar((unsigned char)azCompileOpt[i][n])==0
    ){
      return 1;
    }
  }
  return 0;
}